

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void FinalizeAlloca(ExpressionContext *ctx,VmModule *module,VariableData *variable)

{
  VariableData **ppVVar1;
  TypeBase *pTVar2;
  FunctionData *pFVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ScopeData *pSVar7;
  VariableData *local_30;
  
  pTVar2 = variable->type;
  pFVar3 = module->currentFunction->function;
  local_30 = variable;
  if (pFVar3 == (FunctionData *)0x0) {
    pSVar7 = ctx->globalScope;
    uVar4 = GetAlignmentOffset(pSVar7->dataSize,pTVar2->alignment);
    lVar5 = (ulong)uVar4 + pSVar7->dataSize;
    pSVar7->dataSize = pTVar2->size + lVar5;
  }
  else {
    pSVar7 = pFVar3->functionScope;
    uVar4 = GetAlignmentOffset(pFVar3->stackSize,pTVar2->alignment);
    lVar5 = (ulong)uVar4 + pFVar3->stackSize;
    pFVar3->stackSize = pTVar2->size + lVar5;
    if (pSVar7 == (ScopeData *)0x0) {
      __assert_fail("scope",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3be,
                    "ScopeData *(anonymous namespace)::AllocateScopeSlot(ExpressionContext &, VmModule *, TypeBase *, unsigned int &)"
                   );
    }
  }
  variable->offset = (uint)lVar5;
  uVar6 = 0;
  do {
    if ((pSVar7->allVariables).count == uVar6) {
      if (variable->isVmAlloca != false) {
        SmallArray<VariableData_*,_4U>::push_back(&pSVar7->variables,&local_30);
        SmallArray<VariableData_*,_4U>::push_back(&pSVar7->allVariables,&local_30);
        SmallArray<VariableData_*,_128U>::push_back(&ctx->variables,&local_30);
        return;
      }
      __assert_fail("variable->isVmAlloca",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x9cb,"void FinalizeAlloca(ExpressionContext &, VmModule *, VariableData *)");
    }
    ppVVar1 = (pSVar7->allVariables).data + uVar6;
    uVar6 = uVar6 + 1;
  } while (*ppVVar1 != variable);
  return;
}

Assistant:

void FinalizeAlloca(ExpressionContext &ctx, VmModule *module, VariableData *variable)
{
	unsigned offset = 0;
	ScopeData *scope = AllocateScopeSlot(ctx, module, variable->type, offset);

	variable->offset = offset;

	bool found = false;

	for(unsigned i = 0, e = scope->allVariables.size(); i < e; i++)
	{
		if(scope->allVariables.data[i] == variable)
		{
			found = true;
			break;
		}
	}

	if(!found)
	{
		assert(variable->isVmAlloca);

		scope->variables.push_back(variable);
		scope->allVariables.push_back(variable);
		ctx.variables.push_back(variable);
	}
}